

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::anon_unknown_6::AssignDescriptorsImpl(DescriptorTable *table,bool eager)

{
  char *__s;
  DescriptorPool *this;
  size_t sVar1;
  FileDescriptor *this_00;
  Descriptor *descriptor;
  EnumDescriptor *pEVar2;
  ServiceDescriptor *pSVar3;
  int i;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int i_2;
  long lVar7;
  string_view name;
  AssignDescriptorsHelper local_58;
  
  if ((anonymous_namespace)::
      AssignDescriptorsImpl(google::protobuf::internal::DescriptorTable_const*,bool)::mu == '\0') {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 AssignDescriptorsImpl(google::protobuf::internal::DescriptorTable_const*,bool)
                                 ::mu);
    if (iVar4 != 0) {
      __cxa_atexit(absl::lts_20250127::Mutex::~Mutex,&AssignDescriptorsImpl::mu,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           AssignDescriptorsImpl(google::protobuf::internal::DescriptorTable_const*,bool)
                           ::mu);
    }
  }
  absl::lts_20250127::Mutex::Lock(&AssignDescriptorsImpl::mu);
  internal::AddDescriptors(table);
  absl::lts_20250127::Mutex::Unlock(&AssignDescriptorsImpl::mu);
  if (eager) {
    uVar6 = 0;
    uVar5 = (ulong)(uint)table->num_deps;
    if (table->num_deps < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 * 8 != uVar6; uVar6 = uVar6 + 8) {
      lVar7 = *(long *)((long)table->deps + uVar6);
      if (lVar7 != 0) {
        local_58.factory_ = (MessageFactory *)CONCAT71(local_58.factory_._1_7_,1);
        absl::lts_20250127::
        call_once<void(&)(google::protobuf::internal::DescriptorTable_const*,bool),google::protobuf::internal::DescriptorTable_const*const&,bool>
                  (*(once_flag **)(lVar7 + 0x18),AssignDescriptorsImpl,
                   (DescriptorTable **)((long)table->deps + uVar6),(bool *)&local_58);
      }
    }
  }
  this = DescriptorPool::internal_generated_pool();
  __s = table->filename;
  sVar1 = strlen(__s);
  name._M_str = __s;
  name._M_len = sVar1;
  this_00 = DescriptorPool::FindFileByName(this,name);
  if (this_00 != (FileDescriptor *)0x0) {
    local_58.factory_ = MessageFactory::generated_factory();
    local_58.offsets_ = table->offsets;
    local_58.file_level_enum_descriptors_ = table->file_level_enum_descriptors;
    local_58.schemas_ = table->schemas;
    local_58.default_instance_data_ = table->default_instances;
    for (iVar4 = 0; iVar4 < this_00->message_type_count_; iVar4 = iVar4 + 1) {
      descriptor = FileDescriptor::message_type(this_00,iVar4);
      AssignDescriptorsHelper::AssignMessageDescriptor(&local_58,descriptor);
    }
    for (iVar4 = 0; iVar4 < this_00->enum_type_count_; iVar4 = iVar4 + 1) {
      pEVar2 = FileDescriptor::enum_type(this_00,iVar4);
      *local_58.file_level_enum_descriptors_ = pEVar2;
      local_58.file_level_enum_descriptors_ = local_58.file_level_enum_descriptors_ + 1;
    }
    if ((this_00->options_->field_0)._impl_.cc_generic_services_ == true) {
      for (lVar7 = 0; lVar7 < this_00->service_count_; lVar7 = lVar7 + 1) {
        pSVar3 = FileDescriptor::service(this_00,(int)lVar7);
        table->file_level_service_descriptors[lVar7] = pSVar3;
      }
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xf14,"file != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

void AssignDescriptorsImpl(const DescriptorTable* table, bool eager) {
  // Ensure the file descriptor is added to the pool.
  {
    // This only happens once per proto file. So a global mutex to serialize
    // calls to AddDescriptors.
    static absl::Mutex mu{absl::kConstInit};
    mu.Lock();
    AddDescriptors(table);
    mu.Unlock();
  }
  if (eager) {
    // Normally we do not want to eagerly build descriptors of our deps.
    // However if this proto is optimized for code size (ie using reflection)
    // and it has a message extending a custom option of a descriptor with that
    // message being optimized for code size as well. Building the descriptors
    // in this file requires parsing the serialized file descriptor, which now
    // requires parsing the message extension, which potentially requires
    // building the descriptor of the message extending one of the options.
    // However we are already updating descriptor pool under a lock. To prevent
    // this the compiler statically looks for this case and we just make sure we
    // first build the descriptors of all our dependencies, preventing the
    // deadlock.
    int num_deps = table->num_deps;
    for (int i = 0; i < num_deps; i++) {
      // In case of weak fields deps[i] could be null.
      if (table->deps[i]) {
        absl::call_once(*table->deps[i]->once, AssignDescriptorsImpl,
                        table->deps[i],
                        /*eager=*/true);
      }
    }
  }

  // Fill the arrays with pointers to descriptors and reflection classes.
  const FileDescriptor* file =
      DescriptorPool::internal_generated_pool()->FindFileByName(
          table->filename);
  ABSL_CHECK(file != nullptr);

  MessageFactory* factory = MessageFactory::generated_factory();

  AssignDescriptorsHelper helper(factory, table->file_level_enum_descriptors,
                                 table->schemas, table->default_instances,
                                 table->offsets);

  for (int i = 0; i < file->message_type_count(); i++) {
    helper.AssignMessageDescriptor(file->message_type(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    helper.AssignEnumDescriptor(file->enum_type(i));
  }
  if (file->options().cc_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      table->file_level_service_descriptors[i] = file->service(i);
    }
  }
}